

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsTTDMoveToTopLevelEvent
          (JsRuntimeHandle runtimeHandle,JsTTDMoveMode moveMode,int64_t snapshotTime,
          int64_t eventTime)

{
  EventLog *this;
  JsErrorCode JVar1;
  JsrtRuntime *runtime;
  undefined4 in_register_00000034;
  JsrtRuntime *runtime_00;
  
  runtime_00 = (JsrtRuntime *)CONCAT44(in_register_00000034,moveMode);
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  this = (*runtimeHandle)->TTDLog;
  if (this != (EventLog *)0x0) {
    JVar1 = TTDHandleBreakpointInfoAndInflate(snapshotTime,runtime_00,*runtimeHandle);
    if (JVar1 == JsNoError) {
      TTD::EventLog::PushMode(this,DebuggerSuppressBreakpoints);
      TTD::EventLog::ReplayRootEventsToTime(this,eventTime);
      TTD::EventLog::DoRtrSnapIfNeeded(this);
      TTD::EventLog::PopMode(this,DebuggerSuppressBreakpoints);
      JVar1 = JsNoError;
    }
    return JVar1;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDMoveToTopLevelEvent(_In_ JsRuntimeHandle runtimeHandle, _In_ JsTTDMoveMode moveMode, _In_ int64_t snapshotTime, _In_ int64_t eventTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else

    JsrtRuntime* runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext* threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    TTD::EventLog* elog = threadContext->TTDLog;
    JsErrorCode res = JsNoError;

    JsErrorCode inflateStatus = TTDHandleBreakpointInfoAndInflate(snapshotTime, runtime, threadContext);
    if(inflateStatus != JsNoError)
    {
        return inflateStatus;
    }

    elog->PushMode(TTD::TTDMode::DebuggerSuppressBreakpoints);
    try
    {
        elog->ReplayRootEventsToTime(eventTime);

        elog->DoRtrSnapIfNeeded();
    }
    catch(...) //we are replaying something that should be known to execute successfully so encountering any error is very bad
    {
        res = JsErrorFatal;
        TTDAssert(false, "Unexpected fatal Error");
    }
    elog->PopMode(TTD::TTDMode::DebuggerSuppressBreakpoints);

    return res;
#endif
}